

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O0

long c_drive(long num,long degree,long speed)

{
  bool local_29;
  robot *cur_robot;
  long speed_local;
  long degree_local;
  long num_local;
  
  local_29 = 3 < (ulong)num;
  if (local_29) {
    __assert_fail("num >= 0 && num <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                  ,0xb6,"long c_drive(long, long, long)");
  }
  if (speed < 0) {
    cur_robot = (robot *)0x0;
  }
  else {
    cur_robot = (robot *)speed;
    if (100 < speed) {
      cur_robot = (robot *)0x64;
    }
  }
  speed_local = degree;
  if (degree < 0) {
    speed_local = -degree;
  }
  if (0x167 < speed_local) {
    speed_local = speed_local % 0x168;
  }
  if (r_debug != 0) {
    printf("\ndrive: degree %ld, speed %ld\n",speed_local,cur_robot);
  }
  robots[num].d_heading = (int)speed_local;
  robots[num].d_speed = (int)cur_robot;
  return 1;
}

Assistant:

long c_drive(long num, long degree, long speed)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  // speed = pop();
  if (speed < 0L)
    speed = 0L;
  else if (speed > 100L)
    speed = 100L;
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  if (r_debug)
    printf("\ndrive: degree %ld, speed %ld\n", degree, speed);

  /* update desired speed and heading */
  cur_robot->d_heading = (int)degree;
  cur_robot->d_speed = (int)speed;

  return (1L);
}